

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

Few<r3d::Plane<1>,_2> * r3d::faces_from_verts(Few<r3d::Vector<1>,_2> *vertices)

{
  double dVar1;
  double dVar2;
  Few<r3d::Plane<1>,_2> *faces;
  Few<r3d::Plane<1>,_2> *in_RDI;
  double dVar3;
  double dVar4;
  
  dVar1 = *(double *)vertices->array_[0].__data;
  dVar2 = *(double *)vertices->array_[1].__data;
  dVar4 = dVar2 - dVar1;
  dVar4 = dVar4 / SQRT(dVar4 * dVar4);
  *(double *)in_RDI->array_ = dVar4;
  dVar3 = dVar1 - dVar2;
  dVar3 = dVar3 / SQRT(dVar3 * dVar3);
  *(double *)(in_RDI->array_ + 1) = dVar3;
  *(double *)((long)in_RDI->array_ + 8) = -dVar4 * dVar1;
  *(double *)((long)in_RDI->array_ + 0x18) = -dVar3 * dVar2;
  return in_RDI;
}

Assistant:

R3D_INLINE Few<Plane<1>, 2> faces_from_verts(Few<Vector<1>, 2> vertices) {
  Few<Plane<1>, 2> faces;
  faces[0].n = normalize(vertices[1] - vertices[0]);
  faces[1].n = normalize(vertices[0] - vertices[1]);
  faces[0].d = -(faces[0].n * vertices[0]);
  faces[1].d = -(faces[1].n * vertices[1]);
  return faces;
}